

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.h
# Opt level: O0

Expression * __thiscall wasm::PossibleContents::makeExpression(PossibleContents *this,Module *wasm)

{
  bool bVar1;
  Global *pGVar2;
  Name name_00;
  Name name;
  Literal local_40;
  Builder local_28;
  Builder builder;
  Module *wasm_local;
  PossibleContents *this_local;
  
  builder.wasm = wasm;
  bVar1 = canMakeExpression(this);
  if (!bVar1) {
    __assert_fail("canMakeExpression()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.h"
                  ,0x136,"Expression *wasm::PossibleContents::makeExpression(Module &)");
  }
  Builder::Builder(&local_28,builder.wasm);
  bVar1 = isLiteral(this);
  if (bVar1) {
    getLiteral(&local_40,this);
    this_local = (PossibleContents *)Builder::makeConstantExpression(&local_28,&local_40);
    wasm::Literal::~Literal(&local_40);
  }
  else {
    name_00 = getGlobal(this);
    pGVar2 = Module::getGlobal(builder.wasm,name_00);
    this_local = (PossibleContents *)
                 Builder::makeGlobalGet(&local_28,name_00,(Type)(pGVar2->type).id);
  }
  return (Expression *)this_local;
}

Assistant:

Expression* makeExpression(Module& wasm) {
    assert(canMakeExpression());
    Builder builder(wasm);
    if (isLiteral()) {
      return builder.makeConstantExpression(getLiteral());
    } else {
      auto name = getGlobal();
      // Note that we load the type from the module, rather than use the type
      // in the GlobalInfo, as that type may not match the global (see comment
      // in the GlobalInfo declaration above).
      return builder.makeGlobalGet(name, wasm.getGlobal(name)->type);
    }
  }